

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

void __thiscall zmq::socket_t::socket_t(socket_t *this,context_t *context_,int type_)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined4 in_EDX;
  context_t *in_RSI;
  socket_base *in_RDI;
  error_t *in_stack_ffffffffffffffe0;
  
  pvVar1 = context_t::operator_cast_to_void_(in_RSI);
  pvVar1 = (void *)zmq_socket(pvVar1,in_EDX);
  zmq::detail::socket_base::socket_base(in_RDI,pvVar1);
  pvVar1 = context_t::operator_cast_to_void_(in_RSI);
  in_RDI[1]._handle = pvVar1;
  if (in_RDI->_handle == (void *)0x0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t(in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return;
}

Assistant:

socket_t(context_t &context_, int type_)
        : detail::socket_base(zmq_socket(static_cast<void*>(context_), type_))
        , ctxptr(static_cast<void*>(context_))
    {
        if (_handle == ZMQ_NULLPTR)
            throw error_t();
    }